

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifc_struct_defs.c
# Opt level: O0

uint16_t ll_gw_scan_result_serialize
                   (llabs_gateway_scan_results_t scan_result,uint8_t num_gw,uint8_t *buff)

{
  uint8_t *local_38;
  uint8_t *buff_cpy;
  uint8_t *buff_local;
  uint8_t num_gw_local;
  undefined4 local_1d;
  uint8_t local_19;
  uint64_t local_15;
  llabs_gateway_scan_results_t scan_result_local;
  
  register0x00000038 = scan_result.id;
  local_1d = scan_result._8_4_;
  local_19 = scan_result.is_repeater;
  local_38 = buff;
  buff_cpy = buff;
  buff_local._2_1_ = num_gw;
  local_15 = register0x00000038;
  scan_result_local.id._0_4_ = local_1d;
  scan_result_local.id._4_1_ = local_19;
  write_uint8(num_gw,&local_38);
  write_uint64(local_15,&local_38);
  write_uint16((uint16_t)scan_result_local.id,&local_38);
  write_uint8(scan_result_local.id._2_1_,&local_38);
  write_uint8(scan_result_local.id._3_1_,&local_38);
  write_uint8(scan_result_local.id._4_1_,&local_38);
  return (short)local_38 - (short)buff_cpy;
}

Assistant:

uint16_t ll_gw_scan_result_serialize(llabs_gateway_scan_results_t scan_result, const uint8_t num_gw,
                                     uint8_t buff[GW_SCAN_INFO_BUFF_SIZE])
{
    uint8_t *buff_cpy = buff;
    write_uint8(num_gw, &buff_cpy);
    write_uint64(scan_result.id, &buff_cpy);
    write_uint16(scan_result.rssi, &buff_cpy);
    write_uint8(scan_result.snr, &buff_cpy);
    write_uint8(scan_result.channel, &buff_cpy);
    write_uint8(scan_result.is_repeater, &buff_cpy);
    return buff_cpy - buff;
}